

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.cc
# Opt level: O1

void __thiscall FloatFormat::FloatFormat(FloatFormat *this,int4 sz)

{
  int4 iVar1;
  int4 iVar2;
  int4 iVar3;
  int4 iVar4;
  
  this->size = sz;
  if (sz == 4) {
    iVar1 = 0x7f;
    iVar3 = 8;
    iVar2 = 0x17;
    iVar4 = 0x1f;
  }
  else {
    if (sz != 8) goto LAB_0021c104;
    iVar1 = 0x3ff;
    iVar3 = 0xb;
    iVar2 = 0x34;
    iVar4 = 0x3f;
  }
  this->signbit_pos = iVar4;
  this->exp_pos = iVar2;
  this->exp_size = iVar3;
  this->frac_pos = 0;
  this->frac_size = iVar2;
  this->bias = iVar1;
  this->jbitimplied = true;
LAB_0021c104:
  this->maxexponent = ~(-1 << ((byte)this->exp_size & 0x1f));
  return;
}

Assistant:

FloatFormat::FloatFormat(int4 sz)

{
  size = sz;

  if (size == 4) {
    signbit_pos = 31;
    exp_pos = 23;
    exp_size = 8;
    frac_pos = 0;
    frac_size = 23;
    bias = 127;
    jbitimplied = true;
  }
  else if (size == 8) {
    signbit_pos = 63;
    exp_pos = 52;
    exp_size = 11;
    frac_pos = 0;
    frac_size = 52;
    bias = 1023;
    jbitimplied = true;
  }
  maxexponent = (1<<exp_size)-1;
}